

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O0

_Bool roaring_bitmap_remove_checked(roaring_bitmap_t *r,uint32_t val)

{
  int iVar1;
  int iVar2;
  roaring_array_t *prVar3;
  roaring_array_t *ra;
  undefined4 in_ESI;
  roaring_array_t *in_RDI;
  int newCardinality;
  container_t *container2;
  uint8_t newtypecode;
  int oldCardinality;
  container_t *container;
  _Bool result;
  uint8_t typecode;
  int i;
  uint16_t hb;
  undefined4 in_stack_ffffffffffffffc8;
  undefined2 in_stack_ffffffffffffffcc;
  undefined2 uVar4;
  undefined1 in_stack_ffffffffffffffce;
  undefined1 uVar5;
  uint8_t in_stack_ffffffffffffffcf;
  undefined1 uVar6;
  roaring_array_t *in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd8;
  undefined4 uVar7;
  uint8_t typecode_00;
  _Bool local_16;
  uint8_t local_15;
  int32_t local_14;
  undefined2 local_e;
  roaring_array_t *local_8;
  
  local_e = (undefined2)((uint)in_ESI >> 0x10);
  local_8 = in_RDI;
  local_14 = ra_get_index((roaring_array_t *)
                          CONCAT17(in_stack_ffffffffffffffcf,
                                   CONCAT16(in_stack_ffffffffffffffce,
                                            CONCAT24(in_stack_ffffffffffffffcc,
                                                     in_stack_ffffffffffffffc8))),0);
  local_16 = false;
  if (-1 < local_14) {
    ra_unshare_container_at_index
              (in_stack_ffffffffffffffd0,
               CONCAT11(in_stack_ffffffffffffffcf,in_stack_ffffffffffffffce));
    prVar3 = (roaring_array_t *)ra_get_container_at_index(local_8,(uint16_t)local_14,&local_15);
    iVar1 = container_get_cardinality
                      ((container_t *)
                       CONCAT17(in_stack_ffffffffffffffcf,
                                CONCAT16(in_stack_ffffffffffffffce,
                                         CONCAT24(in_stack_ffffffffffffffcc,
                                                  in_stack_ffffffffffffffc8))),'\0');
    uVar7 = CONCAT13(local_15,(int3)in_stack_ffffffffffffffd8);
    ra = (roaring_array_t *)
         container_remove((container_t *)CONCAT44(iVar1,uVar7),
                          (uint16_t)((ulong)in_stack_ffffffffffffffd0 >> 0x30),
                          (uint8_t)((ulong)in_stack_ffffffffffffffd0 >> 0x28),
                          (uint8_t *)
                          CONCAT17(in_stack_ffffffffffffffcf,
                                   CONCAT16(in_stack_ffffffffffffffce,
                                            CONCAT24(in_stack_ffffffffffffffcc,
                                                     in_stack_ffffffffffffffc8))));
    typecode_00 = (uint8_t)((uint)uVar7 >> 0x18);
    if (ra != prVar3) {
      container_free(ra,in_stack_ffffffffffffffcf);
      ra_set_container_at_index(local_8,local_14,ra,typecode_00);
    }
    iVar2 = container_get_cardinality
                      ((container_t *)
                       CONCAT17(in_stack_ffffffffffffffcf,
                                CONCAT16(in_stack_ffffffffffffffce,
                                         CONCAT24(in_stack_ffffffffffffffcc,
                                                  in_stack_ffffffffffffffc8))),'\0');
    uVar4 = (undefined2)iVar2;
    uVar5 = (undefined1)((uint)iVar2 >> 0x10);
    uVar6 = (undefined1)((uint)iVar2 >> 0x18);
    if (iVar2 == 0) {
      ra_remove_at_index_and_free(ra,0);
    }
    else {
      ra_set_container_at_index(local_8,local_14,ra,typecode_00);
    }
    local_16 = iVar1 != CONCAT13(uVar6,CONCAT12(uVar5,uVar4));
  }
  return local_16;
}

Assistant:

bool roaring_bitmap_remove_checked(roaring_bitmap_t *r, uint32_t val) {
    const uint16_t hb = val >> 16;
    const int i = ra_get_index(&r->high_low_container, hb);
    uint8_t typecode;
    bool result = false;
    if (i >= 0) {
        ra_unshare_container_at_index(&r->high_low_container, (uint16_t)i);
        container_t *container = ra_get_container_at_index(
            &r->high_low_container, (uint16_t)i, &typecode);

        const int oldCardinality =
            container_get_cardinality(container, typecode);

        uint8_t newtypecode = typecode;
        container_t *container2 =
            container_remove(container, val & 0xFFFF, typecode, &newtypecode);
        if (container2 != container) {
            container_free(container, typecode);
            ra_set_container_at_index(&r->high_low_container, i, container2,
                                      newtypecode);
        }

        const int newCardinality =
            container_get_cardinality(container2, newtypecode);

        if (newCardinality != 0) {
            ra_set_container_at_index(&r->high_low_container, i, container2,
                                      newtypecode);
        } else {
            ra_remove_at_index_and_free(&r->high_low_container, i);
        }

        result = oldCardinality != newCardinality;
    }
    return result;
}